

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_handle.cpp
# Opt level: O3

torrent_handle __thiscall
libtorrent::session_handle::add_torrent(session_handle *this,add_torrent_params *params)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar1;
  error_category *peVar2;
  bool bVar3;
  torrent_info *__args;
  long in_RDX;
  torrent_handle tVar4;
  error_code ec;
  reference_wrapper<boost::system::error_code> ecr;
  error_code local_38;
  undefined1 *local_28;
  
  bVar3 = digest32<160L>::is_all_zeros((digest32<160L> *)(in_RDX + 0x124));
  if (bVar3) {
    bVar3 = digest32<256L>::is_all_zeros((digest32<256L> *)(in_RDX + 0x138));
    __args = *(torrent_info **)(in_RDX + 8);
    if (__args == (torrent_info *)0x0 && bVar3) {
      *(undefined4 *)(in_RDX + 0x134) = *(undefined4 *)(in_RDX + 0x120);
      uVar1 = *(undefined8 *)(in_RDX + 0x118);
      *(undefined8 *)(((digest32<160L> *)(in_RDX + 0x124))->m_number)._M_elems =
           *(undefined8 *)(in_RDX + 0x110);
      *(undefined8 *)(in_RDX + 300) = uVar1;
      goto LAB_002a4f26;
    }
  }
  else {
    __args = *(torrent_info **)(in_RDX + 8);
  }
  if (__args != (torrent_info *)0x0) {
    local_38.val_ = 0;
    local_38.failed_ = false;
    local_38._5_3_ = 0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<libtorrent::torrent_info,std::allocator<libtorrent::torrent_info>,libtorrent::torrent_info&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_38.cat_,
               (torrent_info **)&local_38,(allocator<libtorrent::torrent_info> *)&local_28,__args);
    peVar2 = local_38.cat_;
    uVar1 = local_38._0_8_;
    local_38.val_ = 0;
    local_38.failed_ = false;
    local_38._5_3_ = 0;
    local_38.cat_ = (error_category *)0x0;
    this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(in_RDX + 0x10);
    *(undefined8 *)(in_RDX + 8) = uVar1;
    *(error_category **)(in_RDX + 0x10) = peVar2;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38.cat_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38.cat_);
      }
    }
  }
LAB_002a4f26:
  local_38._0_8_ = local_38._0_8_ & 0xffffff0000000000;
  local_38.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  local_28 = (undefined1 *)&local_38;
  tVar4 = sync_call_ret<libtorrent::torrent_handle,libtorrent::torrent_handle(libtorrent::aux::session_impl::*)(libtorrent::add_torrent_params&&,boost::system::error_code&),libtorrent::add_torrent_params,std::reference_wrapper<boost::system::error_code>&>
                    (this,(offset_in_session_impl_to_subr)params,
                     (add_torrent_params *)aux::session_impl::add_torrent,
                     (reference_wrapper<boost::system::error_code> *)0x0);
  if (local_38.failed_ != true) {
    tVar4.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (torrent_handle)
           tVar4.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>;
  }
  aux::throw_ex<boost::system::system_error,boost::system::error_code&>(&local_38);
}

Assistant:

torrent_handle session_handle::add_torrent(add_torrent_params&& params)
	{
		TORRENT_ASSERT_PRECOND(!params.save_path.empty());

#if TORRENT_ABI_VERSION < 3
		if (!params.info_hashes.has_v1() && !params.info_hashes.has_v2() && !params.ti)
			params.info_hashes.v1 = params.info_hash;
#endif

		// the internal torrent object keeps and mutates state in the
		// torrent_info object. We can't let that leak back to the client
		if (params.ti)
			params.ti = std::make_shared<torrent_info>(*params.ti);

#if TORRENT_ABI_VERSION == 1
		handle_backwards_compatible_resume_data(params);
#endif
		error_code ec;
		auto ecr = std::ref(ec);
		auto r = sync_call_ret<torrent_handle>(&session_impl::add_torrent, std::move(params), ecr);
		if (ec) aux::throw_ex<system_error>(ec);
		return r;
	}